

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphs.cpp
# Opt level: O2

void __thiscall Graph::graphCompress(Graph *this,Graph *dest,int n)

{
  pointer pNVar1;
  pointer psVar2;
  _Base_ptr p_Var3;
  iterator iVar4;
  ulong uVar5;
  long lVar6;
  pointer pNVar7;
  ulong uVar8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nodeSet;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> e;
  string label;
  string r;
  string l;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  undefined1 local_130 [64];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90;
  string local_70;
  string local_50;
  
  (*dest->_vptr_Graph[1])(dest);
  local_160._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_160._M_impl.super__Rb_tree_header._M_header;
  local_160._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_160._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_160._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar8 = 0;
  uVar5 = 0;
  if (0 < n) {
    uVar5 = (ulong)(uint)n;
  }
  local_160._M_impl.super__Rb_tree_header._M_header._M_right =
       local_160._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    pNVar7 = (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_start;
    pNVar1 = (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (((uVar8 == uVar5) || ((long)(int)((ulong)((long)pNVar1 - (long)pNVar7) >> 6) <= (long)uVar8)
        ) || ((ulong)(long)n <= local_160._M_impl.super__Rb_tree_header._M_node_count)) break;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_160,&pNVar7[uVar8].id);
    psVar2 = (this->edges).
             super__Vector_base<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (p_Var3 = psVar2[uVar8]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &psVar2[uVar8]._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_130,
           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(p_Var3 + 1));
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_160,
                 &(this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)local_130._0_4_].id);
      std::__cxx11::string::~string((string *)(local_130 + 8));
    }
    uVar8 = uVar8 + 1;
  }
  for (; pNVar7 != pNVar1; pNVar7 = pNVar7 + 1) {
    Node::Node((Node *)local_130,pNVar7);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&local_160,(key_type *)local_130);
    if ((_Rb_tree_header *)iVar4._M_node != &local_160._M_impl.super__Rb_tree_header) {
      insertNode(dest,(Node *)local_130);
    }
    Node::~Node((Node *)local_130);
  }
  for (lVar6 = 0;
      lVar6 < (int)((ulong)((long)(this->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 6); lVar6 = lVar6 + 1)
  {
    psVar2 = (this->edges).
             super__Vector_base<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (p_Var3 = psVar2[lVar6]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &psVar2[lVar6]._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_130,
           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(p_Var3 + 1));
      std::__cxx11::string::string
                (local_b0,(string *)
                          ((this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar6));
      std::__cxx11::string::string
                (local_d0,(string *)
                          ((this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                           super__Vector_impl_data._M_start + (int)local_130._0_4_));
      std::__cxx11::string::string(local_f0,(string *)(local_130 + 8));
      std::__cxx11::string::string((string *)&local_90,local_b0);
      std::__cxx11::string::string((string *)&local_50,local_d0);
      std::__cxx11::string::string((string *)&local_70,local_f0);
      insertEdge(dest,&local_90,&local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string((string *)(local_130 + 8));
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_160);
  return;
}

Assistant:

void Graph::graphCompress(Graph &dest, int n) {
    dest.clear();

    set<string> nodeSet;

    for (int i = 0; i < n && i < this->nodeNum() && nodeSet.size() < n; i++) {
        nodeSet.insert(this->nodes[i].id);
        for (pair<int, string> e : this->edges[i]) {
            nodeSet.insert(this->nodes[e.first].id);
        }
    }

    for (Node i : this->nodes) {
        if (nodeSet.find(i.id) != nodeSet.end())
            dest.insertNode(i);
    }

    for (int i = 0; i < this->nodeNum(); i++) {
        for (pair<int, string> e : this->edges[i]) {
            string l = this->nodes[i].id;
            string r = this->nodes[e.first].id;
            string label = e.second;
            dest.insertEdge(l, r, label);
        }
    }
}